

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::android::testMandatoryExtensions
          (TestStatus *__return_storage_ptr__,Context *context)

{
  TestLog *log;
  bool bVar1;
  qpTestResult qVar2;
  InstanceInterface *vki;
  VkPhysicalDevice physicalDevice;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> extensions;
  ResultCollector results;
  allocator<char> local_129;
  string local_128;
  RequiredExtension local_108;
  _Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> local_c8;
  undefined1 local_b0 [80];
  Maybe<unsigned_int> local_60;
  Maybe<unsigned_int> local_50;
  Maybe<unsigned_int> local_40;
  Maybe<unsigned_int> local_30;
  
  log = context->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"",(allocator<char> *)&local_128);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_b0,log,&local_108.name);
  std::__cxx11::string::~string((string *)&local_108);
  ::vk::enumerateInstanceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             &local_c8,context->m_platformInterface,(char *)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"VK_KHR_get_physical_device_properties2",&local_129);
  local_30.m_ptr = (uint *)0x0;
  local_40.m_ptr = (uint *)0x0;
  ::vk::RequiredExtension::RequiredExtension(&local_108,&local_128,&local_30,&local_40);
  bVar1 = ::vk::isExtensionSupported
                    ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                      *)&local_c8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"VK_KHR_get_physical_device_properties2",&local_129);
    std::operator+(&local_108.name,&local_128," is not supported");
    tcu::ResultCollector::fail((ResultCollector *)local_b0,&local_108.name);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
  }
  std::_Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
  ~_Vector_base(&local_c8);
  vki = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::enumerateDeviceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             &local_c8,vki,physicalDevice,(char *)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"VK_KHR_maintenance1",&local_129);
  local_50.m_ptr = (uint *)0x0;
  local_60.m_ptr = (uint *)0x0;
  ::vk::RequiredExtension::RequiredExtension(&local_108,&local_128,&local_50,&local_60);
  bVar1 = ::vk::isExtensionSupported
                    ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                      *)&local_c8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"VK_KHR_maintenance1",&local_129);
    std::operator+(&local_108.name,&local_128," is not supported");
    tcu::ResultCollector::fail((ResultCollector *)local_b0,&local_108.name);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
  }
  std::_Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
  ~_Vector_base(&local_c8);
  qVar2 = tcu::ResultCollector::getResult((ResultCollector *)local_b0);
  std::__cxx11::string::string((string *)&local_108,(string *)(local_b0 + 0x30));
  __return_storage_ptr__->m_code = qVar2;
  std::__cxx11::string::string
            ((string *)&__return_storage_ptr__->m_description,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testMandatoryExtensions (Context& context)
{
	TestLog&				log		= context.getTestContext().getLog();
	tcu::ResultCollector	results	(log);

	// Instance extensions
	{
		static const char*					mandatoryExtensions[]	=
		{
			"VK_KHR_get_physical_device_properties2",
		};
		const vector<VkExtensionProperties>	extensions				= enumerateInstanceExtensionProperties(context.getPlatformInterface(), DE_NULL);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(mandatoryExtensions); ++ndx)
		{
			if (!isExtensionSupported(extensions, RequiredExtension(mandatoryExtensions[ndx])))
				results.fail(string(mandatoryExtensions[ndx]) + " is not supported");
		}
	}

	// Device extensions
	{
		static const char*					mandatoryExtensions[]	=
		{
			"VK_KHR_maintenance1",
		};
		const vector<VkExtensionProperties>	extensions				= enumerateDeviceExtensionProperties(context.getInstanceInterface(), context.getPhysicalDevice(), DE_NULL);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(mandatoryExtensions); ++ndx)
		{
			if (!isExtensionSupported(extensions, RequiredExtension(mandatoryExtensions[ndx])))
				results.fail(string(mandatoryExtensions[ndx]) + " is not supported");
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}